

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEseqFloatVisitor.cpp
# Opt level: O1

void __thiscall
IRT::CEseqFloatVisitor::processCallArgument
          (CEseqFloatVisitor *this,CExpression *argExp,CExpressionList *tempExpressionList,
          vector<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::allocator<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>
          *helpStatements)

{
  CEseqExpression *this_00;
  CStatement *pCVar1;
  CTempExpression *pCVar2;
  CExpression *pCVar3;
  CMoveStatement *this_01;
  pointer *__ptr;
  CTemp argTemp;
  _Head_base<0UL,_const_IRT::CStatement_*,_false> local_68;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_60;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_58;
  CTemp local_50;
  
  if (argExp == (CExpression *)0x0) {
    this_00 = (CEseqExpression *)0x0;
  }
  else {
    this_00 = (CEseqExpression *)
              __dynamic_cast(argExp,&CExpression::typeinfo,&CEseqExpression::typeinfo,0);
  }
  if (this_00 != (CEseqExpression *)0x0) {
    pCVar1 = CEseqExpression::getStatement(this_00);
    (*(pCVar1->super_IStatement).super_INode._vptr_INode[3])(&local_50,pCVar1);
    std::
    vector<std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>,std::allocator<std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>>>
    ::
    emplace_back<std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>>
              ((vector<std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>,std::allocator<std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>>>
                *)helpStatements,
               (unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> *)
               &local_50);
    if ((long *)local_50.name._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_50.name._M_dataplus._M_p + 0x10))();
    }
  }
  CTemp::CTemp(&local_50);
  pCVar2 = (CTempExpression *)operator_new(0x28);
  CTempExpression::CTempExpression(pCVar2,&local_50);
  CExpressionList::Add(tempExpressionList,(CExpression *)pCVar2);
  if (this_00 == (CEseqExpression *)0x0) {
    (*(argExp->super_IExpression).super_INode._vptr_INode[3])(&local_68,argExp);
  }
  else {
    pCVar3 = CEseqExpression::getExpression(this_00);
    (*(pCVar3->super_IExpression).super_INode._vptr_INode[3])(&local_68,pCVar3);
  }
  this_01 = (CMoveStatement *)operator_new(0x18);
  pCVar2 = (CTempExpression *)operator_new(0x28);
  CTempExpression::CTempExpression(pCVar2,&local_50);
  local_60._M_head_impl = (CExpression *)local_68._M_head_impl;
  local_58._M_head_impl = (CExpression *)pCVar2;
  CMoveStatement::CMoveStatement
            (this_01,(unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
                      *)&local_58,
             (unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> *)
             &local_60);
  local_68._M_head_impl = (CStatement *)this_01;
  std::
  vector<std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>,std::allocator<std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>>>
  ::emplace_back<std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>>
            ((vector<std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>,std::allocator<std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>>>
              *)helpStatements,
             (unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> *)
             &local_68);
  if ((CMoveStatement *)local_68._M_head_impl != (CMoveStatement *)0x0) {
    (*((INode *)&((local_68._M_head_impl)->super_IStatement).super_INode._vptr_INode)->_vptr_INode
      [2])();
  }
  local_68._M_head_impl = (CStatement *)0x0;
  if (local_60._M_head_impl != (CExpression *)0x0) {
    (*(((IStatement *)&(local_60._M_head_impl)->super_IExpression)->super_INode)._vptr_INode[2])();
  }
  local_60._M_head_impl = (CExpression *)0x0;
  if ((CTempExpression *)local_58._M_head_impl != (CTempExpression *)0x0) {
    (*(((CExpression *)&(local_58._M_head_impl)->super_IExpression)->super_IExpression).super_INode.
      _vptr_INode[2])();
  }
  local_58._M_head_impl = (CExpression *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.name._M_dataplus._M_p != &local_50.name.field_2) {
    operator_delete(local_50.name._M_dataplus._M_p);
  }
  return;
}

Assistant:

void IRT::CEseqFloatVisitor::processCallArgument(
        const IRT::CExpression *argExp,
        IRT::CExpressionList *tempExpressionList,
        std::vector<std::unique_ptr<const IRT::CStatement>> &helpStatements) {

    const CEseqExpression* argEseq = CAST_TO_ESEQ(argExp);

    if (argEseq != nullptr) {
        helpStatements.push_back(std::move(argEseq->getStatement()->Copy()));
    }

    CTemp argTemp;
    tempExpressionList->Add(new CTempExpression(argTemp));

    std::unique_ptr<const CExpression> source;
    if (argEseq != nullptr) {
        source = std::move(argEseq->getExpression()->Copy());
    } else {
        source = std::move(argExp->Copy());
    }

    helpStatements.push_back(SMOVE_UNIQ(new CMoveStatement(
            EMOVE_UNIQ(EMOVE_UNIQ(new CTempExpression(argTemp))),
            std::move(source)
    )));
}